

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationDecPOMDPDiscrete.cpp
# Opt level: O2

Index __thiscall
SimulationDecPOMDPDiscrete::GetAction
          (SimulationDecPOMDPDiscrete *this,
          vector<AgentDelayedSharedObservations_*,_std::allocator<AgentDelayedSharedObservations_*>_>
          *agents,Index i,Index jaI,Index joI,double r,Index prevJoI,Index sI,Index prevJaI,
          double *specialR)

{
  long *plVar1;
  Index IVar2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  if (joI == 0x7fffffff) {
    plVar1 = *(long **)(*(long *)agents + (ulong)i * 8);
    IVar2 = (**(code **)(*plVar1 + 0x40))(plVar1,0x7fffffff,prevJoI);
    return IVar2;
  }
  PlanningUnitMADPDiscrete::JointToIndividualObservationIndices
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             &this->_m_pu->super_PlanningUnitMADPDiscrete,joI);
  plVar1 = *(long **)(*(long *)agents + (ulong)i * 8);
  IVar2 = (**(code **)(*plVar1 + 0x40))
                    (plVar1,local_38._M_impl.super__Vector_impl_data._M_start[i],prevJoI);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return IVar2;
}

Assistant:

Index SimulationDecPOMDPDiscrete::
GetAction(const vector<AgentDelayedSharedObservations*> &agents,
          Index i, Index jaI, Index joI, double r, Index prevJoI,
          Index sI, Index prevJaI, double &specialR) const
{
    if(joI==INT_MAX) //first stage: there is no joI
        return(agents[i]->Act(INT_MAX,prevJoI));
    else
    {
        vector<Index> oIs=_m_pu->JointToIndividualObservationIndices(joI);
        return(agents[i]->Act(oIs[i],prevJoI));
    }
}